

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall leveldb::BlockHandle::DecodeFrom(BlockHandle *this,Slice *input)

{
  bool bVar1;
  Slice *in_RDI;
  char *in_stack_ffffffffffffffa8;
  Slice *msg;
  uint64_t *in_stack_ffffffffffffffd0;
  Slice *in_stack_ffffffffffffffd8;
  
  msg = in_RDI;
  bVar1 = GetVarint64(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if ((bVar1) && (bVar1 = GetVarint64(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), bVar1))
  {
    Status::OK();
  }
  else {
    Slice::Slice(in_RDI,in_stack_ffffffffffffffa8);
    Slice::Slice((Slice *)&stack0xffffffffffffffc8);
    Status::Corruption(msg,in_RDI);
  }
  return (Status)(char *)msg;
}

Assistant:

Status BlockHandle::DecodeFrom(Slice* input) {
  if (GetVarint64(input, &offset_) &&
      GetVarint64(input, &size_)) {
    return Status::OK();
  } else {
    return Status::Corruption("bad block handle");
  }
}